

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

bool __thiscall
math::wide_integer::uintwide_t<384U,_unsigned_int,_void,_false>::rd_string
          (uintwide_t<384U,_unsigned_int,_void,_false> *this,char *str_input,
          unsigned_fast_type count,int base_hint)

{
  value_type_conflict *pvVar1;
  value_type_conflict *pvVar2;
  int *piVar3;
  uint uVar4;
  uint uVar5;
  representation_type *prVar6;
  byte bVar7;
  ulong uVar8;
  byte bVar9;
  uint uVar10;
  long lVar11;
  bool bVar12;
  ulong uVar13;
  bool bVar14;
  undefined1 local_60 [20];
  undefined1 auStack_4c [12];
  value_type_conflict local_40;
  undefined1 auStack_3c [12];
  
  prVar6 = &this->values;
  (prVar6->super_array<unsigned_int,_12UL>).elems[8] = 0;
  (prVar6->super_array<unsigned_int,_12UL>).elems[9] = 0;
  (prVar6->super_array<unsigned_int,_12UL>).elems[10] = 0;
  (prVar6->super_array<unsigned_int,_12UL>).elems[0xb] = 0;
  prVar6 = &this->values;
  (prVar6->super_array<unsigned_int,_12UL>).elems[4] = 0;
  (prVar6->super_array<unsigned_int,_12UL>).elems[5] = 0;
  (prVar6->super_array<unsigned_int,_12UL>).elems[6] = 0;
  (prVar6->super_array<unsigned_int,_12UL>).elems[7] = 0;
  (this->values).super_array<unsigned_int,_12UL>.elems[0] = 0;
  (this->values).super_array<unsigned_int,_12UL>.elems[1] = 0;
  (this->values).super_array<unsigned_int,_12UL>.elems[2] = 0;
  (this->values).super_array<unsigned_int,_12UL>.elems[3] = 0;
  if (count == 0xffffffffffffffff) {
    if (*str_input == '\0') {
      return true;
    }
    uVar13 = 0;
    do {
      count = uVar13 + 1;
      lVar11 = uVar13 + 1;
      uVar13 = count;
    } while (str_input[lVar11] != '\0');
  }
  if (count == 0) {
    if ((char)base_hint == '\0') {
      base_hint = 10;
    }
    bVar14 = false;
    count = 0;
    uVar13 = 0;
  }
  else {
    bVar14 = *str_input == '-';
    uVar13 = (ulong)(*str_input == '+' || bVar14);
    if ((char)base_hint == '\0') {
      base_hint = 10;
      if (uVar13 < count) {
        if (str_input[uVar13] == '0') {
          if ((byte)(str_input[uVar13 + 1] - 0x30U) < 9) {
            uVar13 = uVar13 + 1;
            base_hint = 8;
          }
          else if ((byte)(str_input[uVar13 + 1] | 0x20U) == 0x78) {
            uVar13 = uVar13 | 2;
            base_hint = 0x10;
          }
        }
      }
      else {
        count = 1;
        uVar13 = 1;
      }
    }
  }
  bVar12 = true;
  if (count <= uVar13) {
LAB_001ac059:
    if (bVar14) {
      lVar11 = 0;
      do {
        pvVar1 = (this->values).super_array<unsigned_int,_12UL>.elems + lVar11;
        uVar10 = pvVar1[1];
        uVar4 = pvVar1[2];
        uVar5 = pvVar1[3];
        pvVar2 = (this->values).super_array<unsigned_int,_12UL>.elems + lVar11;
        *pvVar2 = *pvVar1 ^ 0xffffffff;
        pvVar2[1] = uVar10 ^ 0xffffffff;
        pvVar2[2] = uVar4 ^ 0xffffffff;
        pvVar2[3] = uVar5 ^ 0xffffffff;
        lVar11 = lVar11 + 4;
      } while (lVar11 != 0xc);
      lVar11 = 0;
      do {
        piVar3 = (int *)((long)(this->values).super_array<unsigned_int,_12UL>.elems + lVar11);
        *piVar3 = *piVar3 + 1;
        if (*piVar3 != 0) {
          return bVar12;
        }
        bVar14 = lVar11 != 0x2c;
        lVar11 = lVar11 + 4;
      } while (bVar14);
    }
    return bVar12;
  }
  do {
    bVar7 = str_input[uVar13];
    bVar12 = true;
    if (bVar7 != 0x27) {
      if ((char)base_hint == '\x10') {
        bVar9 = bVar7 - 0x30;
        bVar12 = (bVar9 < 10 || (byte)(bVar7 + 0xbf) < 6) || (byte)(bVar7 + 0x9f) < 6;
        if ((bVar9 < 10) ||
           ((bVar7 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar7 - 0x41) & 0x3f) & 1) != 0))))
        {
          if ((byte)(bVar7 + 0x9f) < 6) {
            bVar7 = bVar7 + 0xa9;
          }
          else if ((byte)(bVar7 + 0xbf) < 6) {
            bVar7 = bVar7 - 0x37;
          }
          else {
            bVar7 = bVar7 - 0x30;
            if (9 < bVar9) {
              bVar7 = 0;
            }
          }
          uVar10 = 0;
          lVar11 = 0;
          do {
            uVar4 = *(uint *)((long)(this->values).super_array<unsigned_int,_12UL>.elems + lVar11);
            *(uint *)((long)(this->values).super_array<unsigned_int,_12UL>.elems + lVar11) =
                 uVar4 << 4 | uVar10;
            lVar11 = lVar11 + 4;
            uVar10 = uVar4 >> 0x1c;
          } while (lVar11 != 0x30);
LAB_001ac03e:
          (this->values).super_array<unsigned_int,_12UL>.elems[0] =
               (this->values).super_array<unsigned_int,_12UL>.elems[0] | (uint)bVar7;
        }
      }
      else if ((base_hint & 0xffU) == 10) {
        if (9 < (byte)(bVar7 - 0x30)) goto LAB_001ac056;
        lVar11 = 0;
        uVar8 = 0;
        do {
          uVar8 = uVar8 + (ulong)(this->values).super_array<unsigned_int,_12UL>.elems[lVar11] * 10;
          (this->values).super_array<unsigned_int,_12UL>.elems[lVar11] = (value_type_conflict)uVar8;
          uVar8 = uVar8 >> 0x20;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0xc);
        auStack_3c = SUB1612((undefined1  [16])0x0,4);
        auStack_4c = SUB1612((undefined1  [16])0x0,0);
        local_40 = 0;
        local_60._4_16_ = (undefined1  [16])0x0;
        local_60._0_4_ = ZEXT14((byte)(bVar7 - 0x30));
        operator+=(this,(uintwide_t<384U,_unsigned_int,_void,_false> *)local_60);
      }
      else if ((base_hint & 0xffU) == 8) {
        bVar7 = bVar7 - 0x30;
        if (bVar7 < 9) {
          uVar10 = 0;
          lVar11 = 0;
          do {
            uVar4 = *(uint *)((long)(this->values).super_array<unsigned_int,_12UL>.elems + lVar11);
            *(uint *)((long)(this->values).super_array<unsigned_int,_12UL>.elems + lVar11) =
                 uVar10 + uVar4 * 8;
            lVar11 = lVar11 + 4;
            uVar10 = uVar4 >> 0x1d;
          } while (lVar11 != 0x30);
          goto LAB_001ac03e;
        }
LAB_001ac056:
        bVar12 = false;
        goto LAB_001ac059;
      }
    }
    uVar13 = uVar13 + 1;
    if ((count <= uVar13) || (bVar12 == false)) goto LAB_001ac059;
  } while( true );
}

Assistant:

constexpr auto rd_string(const char* str_input, const unsigned_fast_type count, const int base_hint) -> bool // NOLINT(readability-function-cognitive-complexity,bugprone-easily-swappable-parameters)
    {
      detail::fill_unsafe(values.begin(), values.end(), static_cast<limb_type>(UINT8_C(0)));

      const auto str_length =
        static_cast<unsigned_fast_type>
        (
          (count == (std::numeric_limits<unsigned_fast_type>::max)()) ? detail::strlen_unsafe(str_input) : count
        );

      auto pos = static_cast<unsigned_fast_type>(UINT8_C(0));

      // Detect: Is there a plus sign?
      // And if there is a plus sign, skip over the plus sign.
      if((str_length > static_cast<unsigned_fast_type>(UINT8_C(0))) && (str_input[static_cast<std::size_t>(UINT8_C(0))] == '+')) // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
      {
        ++pos;
      }

      auto str_has_neg_sign = false;

      // Detect: Is there a minus sign?
      // And if there is a minus sign, skip over the minus sign.
      if((str_length > static_cast<unsigned_fast_type>(UINT8_C(0))) && (str_input[static_cast<std::size_t>(UINT8_C(0))] == '-')) // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
      {
        str_has_neg_sign = true;

        ++pos;
      }

      // Set the base if the client has supplied a non-zero base-hint.
      auto base = static_cast<std::uint_fast8_t>(base_hint);

      if(base == static_cast<std::uint_fast8_t>(UINT8_C(0)))
      {
        base = static_cast<std::uint_fast8_t>(UINT8_C(10));

        // Perform a dynamic detection of the base.
        if(str_length > static_cast<unsigned_fast_type>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(0))))
        {
          const auto might_be_oct_or_hex = ((str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(0)))] == '0') && (str_length > static_cast<unsigned_fast_type>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(0))))); // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)

          if(might_be_oct_or_hex)
          {
            if((str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(1)))] >= '0') && (str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(1)))] <= '8')) // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
            {
              // The input format is octal.
              base = static_cast<std::uint_fast8_t>(UINT8_C(8));

              pos = static_cast<unsigned_fast_type>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(1)));
            }
            else if((str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(1)))] == 'x') || (str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(1)))] == 'X')) // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
            {
              // The input format is hexadecimal.
              base = static_cast<std::uint_fast8_t>(UINT8_C(16));

              pos = static_cast<unsigned_fast_type>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(2)));
            }
          }
          else if((str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(0)))] >= '0') && (str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(0)))] <= '9')) // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
          {
            // The input format is decimal.
            ;
          }
        }
      }

      auto char_is_valid = true;

      while((pos < str_length) && char_is_valid) // NOLINT(altera-id-dependent-backward-branch)
      {
        const auto c = str_input[pos++]; // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)

        const auto char_is_apostrophe = (c == static_cast<char>(39));

        if(!char_is_apostrophe)
        {
          if(base == static_cast<std::uint_fast8_t>(UINT8_C(8)))
          {
            char_is_valid = ((c >= '0') && (c <= '8'));

            if(char_is_valid)
            {
              const auto uc_oct = static_cast<std::uint8_t>(c - static_cast<char>(UINT8_C(0x30)));

              static_cast<void>(operator<<=(static_cast<unsigned>(UINT8_C(3))));

              *values.begin() = static_cast<limb_type>(*values.begin() | uc_oct);
            }
          }
          else if(base == static_cast<std::uint_fast8_t>(UINT8_C(10)))
          {
            char_is_valid = ((c >= '0') && (c <= '9'));

            if(char_is_valid)
            {
              const auto uc_dec = static_cast<std::uint8_t>(c - static_cast<char>(UINT8_C(0x30)));

              static_cast<void>(mul_by_limb(static_cast<limb_type>(UINT8_C(10))));

              static_cast<void>(operator+=(uc_dec));
            }
          }
          else if(base == static_cast<std::uint_fast8_t>(UINT8_C(16)))
          {
            const auto char_is_a_to_f_lo((c >= 'a') && (c <= 'f'));
            const auto char_is_a_to_f_hi((c >= 'A') && (c <= 'F'));
            const auto char_is_0_to_9   ((c >= '0') && (c <= '9'));

            char_is_valid = (char_is_a_to_f_lo || char_is_a_to_f_hi || char_is_0_to_9);

            if(char_is_valid)
            {
              auto uc_hex = static_cast<std::uint8_t>(UINT8_C(0));

              if     (char_is_a_to_f_lo) { uc_hex = static_cast<std::uint8_t>(c - static_cast<char>(UINT8_C(  87))); }
              else if(char_is_a_to_f_hi) { uc_hex = static_cast<std::uint8_t>(c - static_cast<char>(UINT8_C(  55))); }
              else if(char_is_0_to_9)    { uc_hex = static_cast<std::uint8_t>(c - static_cast<char>(UINT8_C(0x30))); }

              static_cast<void>(operator<<=(static_cast<unsigned>(UINT8_C(4))));

              *values.begin() = static_cast<limb_type>(*values.begin() | uc_hex);
            }
          }
        }
      }

      if(str_has_neg_sign)
      {
        // Exclude this line from code coverage, even though explicit
        // test cases (search for "result_overshift_is_ok") are known
        // to cover this line.
        negate(); // LCOV_EXCL_LINE
      }

      return char_is_valid;
    }